

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

size_t __thiscall Memory::Recycler::RescanMark(Recycler *this,DWORD waitTime)

{
  ObservableValue<Memory::CollectionState> *pOVar1;
  byte bVar2;
  ObservableValueObserver<Memory::CollectionState> *pOVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  size_t sVar10;
  CollectionState CVar11;
  CollectionState local_34;
  AutoFilterExceptionRegion local_30;
  AutoFilterExceptionRegion local_2c;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  AutoFilterExceptionRegion __autoFilterExceptionRegion_1;
  
  bVar6 = this->needOOMRescan;
  if ((this->inPartialCollectMode == false) && (bVar5 = DoQueueTrackedObject(this), !bVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x966,"(this->inPartialCollectMode || DoQueueTrackedObject())",
                       "this->inPartialCollectMode || DoQueueTrackedObject()");
    if (!bVar5) goto LAB_0070dc73;
    *puVar9 = 0;
  }
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_30,ExceptionType_All);
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[2])();
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_30);
  if ((this->collectionState).value != CollectionStateRescanFindRoots) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x973,"(collectionState == CollectionStateRescanFindRoots)",
                       "collectionState == CollectionStateRescanFindRoots");
    if (!bVar5) goto LAB_0070dc73;
    *puVar9 = 0;
  }
  if ((bVar6 == false) &&
     (((bVar6 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Force,BackgroundFinishMarkPhase),
       waitTime != 0xffffffff || (bVar6)) &&
      (bVar2 = this->backgroundFinishMarkCount,
      uVar7 = RecyclerHeuristic::MaxBackgroundFinishMarkCount(this->recyclerFlagsTable),
      bVar2 < uVar7)))) {
    PrepareBackgroundFindRoots(this);
    bVar6 = StartConcurrent(this,CollectionStateConcurrentFinishMark);
    if (bVar6) {
      this->backgroundFinishMarkCount = this->backgroundFinishMarkCount + '\x01';
      HeapInfoManager::PrepareSweep(&this->autoHeap);
      BVar8 = WaitForConcurrentThread(this,waitTime,WaitReasonNone);
      if (BVar8 == 0) {
        bVar6 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,BackgroundFinishMarkPhase);
        if (bVar6) {
          Output::Print(L"Finish mark timed out\n");
          Output::Flush();
        }
        AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_2c,ExceptionType_All);
        (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[4])();
        AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_2c);
        return 0xffffffffffffffff;
      }
      pOVar1 = &this->collectionState;
      if (pOVar1->value == CollectionStateRescanWait) {
        bVar6 = false;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x98f,"(collectionState == CollectionStateRescanWait)",
                           "collectionState == CollectionStateRescanWait");
        if (!bVar6) {
LAB_0070dc73:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
        bVar6 = pOVar1->value == CollectionStateRescanFindRoots;
      }
      local_34 = CollectionStateRescanFindRoots;
      pOVar3 = (this->collectionState).observer;
      CVar11 = CollectionStateRescanFindRoots;
      if ((pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) && (!bVar6)) {
        (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,&local_34,pOVar1);
        CVar11 = local_34;
      }
      (this->collectionState).value = CVar11;
      return this->backgroundRescanRootBytes;
    }
    RevertPrepareBackgroundFindRoots(this);
  }
  this->backgroundFinishMarkCount = '\0';
  sVar10 = FinishMarkRescan(this,false);
  return sVar10 << 0xc;
}

Assistant:

size_t
Recycler::RescanMark(DWORD waitTime)
{
    bool const onLowMemory = this->NeedOOMRescan();

    // REVIEW: Why are we asserting for DoQueueTrackedObject here?
    // Should we split this into different asserts depending on whether
    // concurrent or partial is enabled?
#if ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || DoQueueTrackedObject());
#else
    Assert(DoQueueTrackedObject());
#endif
#endif

    {
        // We are about to do a rescan mark, which for consistency requires the runtime to stop any additional mutator threads
        AUTO_NO_EXCEPTION_REGION;
        collectionWrapper->PreRescanMarkCallback();
    }

    // Always called in-thread
    Assert(collectionState == CollectionStateRescanFindRoots);
#if ENABLE_CONCURRENT_GC
    if (!onLowMemory && // Don't do background finish mark if we are low on memory
        // Only do background finish mark if we have a time limit or it is forced
        (CUSTOM_PHASE_FORCE1(GetRecyclerFlagsTable(), Js::BackgroundFinishMarkPhase) || waitTime != INFINITE) &&
        // Don't do background finish mark if we failed to finish mark too many times
        (this->backgroundFinishMarkCount < RecyclerHeuristic::MaxBackgroundFinishMarkCount(this->GetRecyclerFlagsTable())))
    {
        this->PrepareBackgroundFindRoots();
        if (StartConcurrent(CollectionStateConcurrentFinishMark))
        {
            this->backgroundFinishMarkCount++;
            this->PrepareSweep();
            GCETW(GC_RESCANMARKWAIT_START, (this, waitTime));
            const BOOL waited = WaitForConcurrentThread(waitTime, RecyclerWaitReason::RescanMark);
            GCETW(GC_RESCANMARKWAIT_STOP, (this, !waited));
            if (!waited)
            {
                CUSTOM_PHASE_PRINT_TRACE1(GetRecyclerFlagsTable(), Js::BackgroundFinishMarkPhase, _u("Finish mark timed out\n"));

                {
                    // We timed out doing the finish mark, notify the runtime
                    AUTO_NO_EXCEPTION_REGION;
                    collectionWrapper->RescanMarkTimeoutCallback();
                }

                return Recycler::InvalidScanRootBytes;
            }
            Assert(collectionState == CollectionStateRescanWait);
            this->SetCollectionState(CollectionStateRescanFindRoots);
#ifdef RECYCLER_WRITE_WATCH
            if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
            {
                Assert(autoHeap.GetWriteWatchPageCount() == 0);
            }
#endif
            return this->backgroundRescanRootBytes;
        }
        this->RevertPrepareBackgroundFindRoots();
    }
#endif
#if ENABLE_CONCURRENT_GC
    this->backgroundFinishMarkCount = 0;
#endif
    return FinishMarkRescan(false) * AutoSystemInfo::PageSize;
}